

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::anon_unknown_14::TileProcess::run_decode
          (TileProcess *this,exr_const_context_t ctxt,int pn,DeepFrameBuffer *outfb,
          vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *filllist)

{
  int iVar1;
  IoExc *pIVar2;
  ArgExc *pAVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined4 in_EDX;
  undefined8 in_RSI;
  int *in_RDI;
  stringstream _iex_throw_s;
  uint8_t flags;
  exr_attr_box2i_t dw;
  int tileY;
  int tileX;
  int absY;
  int absX;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  DeepFrameBuffer *in_stack_fffffffffffffe28;
  TileProcess *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  DeepFrameBuffer *in_stack_fffffffffffffe48;
  TileProcess *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  DeepFrameBuffer *in_stack_fffffffffffffe98;
  TileProcess *in_stack_fffffffffffffea0;
  vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *in_stack_fffffffffffffeb0;
  byte local_49;
  int local_48;
  int local_44;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined4 local_14;
  undefined8 local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    iVar1 = exr_decoding_update(in_RSI,in_EDX,in_RDI + 2,in_RDI + 0x12);
    if (iVar1 != 0) {
      pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(pIVar2,"Unable to update decode pipeline");
      __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
    local_49 = (byte)*(undefined2 *)((long)in_RDI + 0x5a);
  }
  else {
    iVar1 = exr_decoding_initialize(in_RSI,in_EDX,in_RDI + 2,in_RDI + 0x12);
    if (iVar1 != 0) {
      pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(pIVar2,"Unable to initialize decode pipeline");
      __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
    *(ushort *)((long)in_RDI + 0x5a) = *(ushort *)((long)in_RDI + 0x5a) | 2;
    *(ushort *)((long)in_RDI + 0x5a) = *(ushort *)((long)in_RDI + 0x5a) | 1;
    local_49 = 0;
    *(undefined1 *)(in_RDI + 1) = 0;
  }
  iVar1 = exr_get_data_window(local_10,local_14,&local_48);
  if (iVar1 != 0) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar3,"Unable to query the data window.");
    __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  iVar1 = exr_get_tile_sizes(local_10,local_14,(char)in_RDI[7],*(undefined1 *)((long)in_RDI + 0x1d),
                             &local_34,&local_38);
  if (iVar1 != 0) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar3,"Unable to query the data window.");
    __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  local_2c = local_48 + local_34 * in_RDI[3];
  local_30 = local_44 + local_38 * in_RDI[4];
  if ((*(byte *)((long)in_RDI + 5) & 1) == 0) {
    *(ushort *)((long)in_RDI + 0x5a) = *(ushort *)((long)in_RDI + 0x5a) & 0xfffb;
  }
  else {
    *(ushort *)((long)in_RDI + 0x5a) = *(ushort *)((long)in_RDI + 0x5a) | 4;
  }
  update_pointers(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                  in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18);
  if (((ushort)local_49 != *(ushort *)((long)in_RDI + 0x5a)) &&
     (iVar1 = exr_decoding_choose_default_routines(local_10,local_14,in_RDI + 0x12), iVar1 != 0)) {
    pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc(pIVar2,"Unable to choose decoder routines");
    __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
  }
  iVar1 = exr_decoding_run(local_10,local_14,in_RDI + 0x12);
  *in_RDI = iVar1;
  if (*in_RDI == 0) {
    copy_sample_count(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                      in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
    ;
    if ((*(byte *)((long)in_RDI + 5) & 1) == 0) {
      run_fill(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
               in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
               in_stack_fffffffffffffeb0);
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe18);
  poVar4 = std::operator<<((ostream *)&stack0xfffffffffffffe28,"Unable to run decoder: ");
  pcVar5 = (char *)exr_get_error_code_as_string(*in_RDI);
  std::operator<<(poVar4,pcVar5);
  pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::IoExc::IoExc(pIVar2,(stringstream *)&stack0xfffffffffffffe18);
  __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
}

Assistant:

void TileProcess::run_decode (
    exr_const_context_t ctxt,
    int pn,
    const DeepFrameBuffer *outfb,
    const std::vector<DeepSlice> &filllist)
{
    int absX, absY, tileX, tileY;
    exr_attr_box2i_t dw;
    uint8_t flags;

    if (first)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");
        }
        decoder.decode_flags |= EXR_DECODE_NON_IMAGE_DATA_AS_POINTERS;
        decoder.decode_flags |= EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL;
        flags = 0;

        first = false;
    }
    else
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_update (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to update decode pipeline");
        }
        flags = decoder.decode_flags;
    }

    if (EXR_ERR_SUCCESS != exr_get_data_window (ctxt, pn, &dw))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    if (EXR_ERR_SUCCESS != exr_get_tile_sizes (
            ctxt, pn, cinfo.level_x, cinfo.level_y, &tileX, &tileY))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    absX = dw.min.x + tileX * cinfo.start_x;
    absY = dw.min.y + tileY * cinfo.start_y;

    if (counts_only)
        decoder.decode_flags |= EXR_DECODE_SAMPLE_DATA_ONLY;
    else
        decoder.decode_flags = decoder.decode_flags & ~EXR_DECODE_SAMPLE_DATA_ONLY;

    update_pointers (outfb, dw.min.x, dw.min.y, absX, absY);

    if (flags != decoder.decode_flags)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_choose_default_routines (ctxt, pn, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
        }
    }

    last_decode_err = exr_decoding_run (ctxt, pn, &decoder);
    if (EXR_ERR_SUCCESS != last_decode_err)
    {
        THROW (
            IEX_NAMESPACE::IoExc,
            "Unable to run decoder: "
            << exr_get_error_code_as_string (last_decode_err));
    }

    copy_sample_count (outfb, dw.min.x, dw.min.y, absX, absY);

    if (counts_only)
        return;

    run_fill (outfb, dw.min.x, dw.min.y, absX, absY, filllist);
}